

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFromObject
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  string *this_00;
  long lVar1;
  int i;
  long lVar2;
  string sStack_48;
  
  this_00 = &sStack_48;
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&sStack_48,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,desc);
  io::Printer::Print(printer,
                     "if (jspb.Message.GENERATE_FROM_OBJECT) {\n/**\n * Loads data from an object into a new instance of this proto.\n * @param {!Object} obj The object representation of this proto to\n *     load the data from.\n * @return {!$classname$}\n */\n$classname$.fromObject = function(obj) {\n  var f, msg = new $classname$();\n"
                     ,"classname",&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(desc + 0x2c); lVar2 = lVar2 + 1) {
    GenerateClassFieldFromObject
              ((Generator *)this_00,options,printer,
               (FieldDescriptor *)(*(long *)(desc + 0x30) + lVar1));
    lVar1 = lVar1 + 0xa8;
  }
  io::Printer::Print(printer,"  return msg;\n};\n}\n");
  return;
}

Assistant:

void Generator::GenerateClassFromObject(const GeneratorOptions& options,
                                        io::Printer* printer,
                                        const Descriptor* desc) const {
  printer->Print(
      "if (jspb.Message.GENERATE_FROM_OBJECT) {\n"
      "/**\n"
      " * Loads data from an object into a new instance of this proto.\n"
      " * @param {!Object} obj The object representation of this proto to\n"
      " *     load the data from.\n"
      " * @return {!$classname$}\n"
      " */\n"
      "$classname$.fromObject = function(obj) {\n"
      "  var f, msg = new $classname$();\n",
      "classname", GetMessagePath(options, desc));

  for (int i = 0; i < desc->field_count(); i++) {
    const FieldDescriptor* field = desc->field(i);
    GenerateClassFieldFromObject(options, printer, field);
  }

  printer->Print(
      "  return msg;\n"
      "};\n"
      "}\n");
}